

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::WriteBlocks(BamToolsIndex *this,BtiBlockVector *blocks)

{
  pointer pBVar1;
  pointer block;
  
  pBVar1 = (blocks->
           super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (block = (blocks->
               super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
               )._M_impl.super__Vector_impl_data._M_start; block != pBVar1; block = block + 1) {
    WriteBlock(this,block);
  }
  return;
}

Assistant:

void BamToolsIndex::WriteBlocks(const BtiBlockVector& blocks) {
    BtiBlockVector::const_iterator blockIter = blocks.begin();
    BtiBlockVector::const_iterator blockEnd  = blocks.end();
    for ( ; blockIter != blockEnd; ++blockIter )
        WriteBlock(*blockIter);
}